

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,AssertStatement *ptr)

{
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"assert",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  arrow(this,ptr,ptr->check);
  (**(ptr->check->super_Base)._vptr_Base)(ptr->check,this);
  return;
}

Assistant:

void gv_visitor::visit(AssertStatement* ptr) {
    box(ptr, "assert");
    arrow(ptr, ptr->check);
    ptr->check->accept(this);
}